

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  GLFWwindow *handle;
  World *pWVar4;
  Vec2d *this;
  Palette *this_00;
  Colour *this_01;
  GLFWwindow *ctx;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    handle = glfwCreateWindow(0x294,0x294,"lanaTetris",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    glfwWindowHint(0x20003,0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      reshape(handle,0x294,0x294);
      gameplayDisplayer = GameplayDisplayer::getInstance();
      uiDisplayer = UIDisplayer::getInstance(660.0,660.0);
      pWVar4 = (World *)operator_new(0xb0);
      this = (Vec2d *)operator_new(8);
      Vec2d::Vec2d(this,10.0,20.0);
      World::World(pWVar4,this,REGULAR_MODE);
      world = pWVar4;
      World::start(pWVar4);
      this_00 = Palette::getInstance();
      this_01 = Palette::getColour(this_00,10);
      fVar5 = Colour::getR(this_01);
      fVar6 = Colour::getG(this_01);
      fVar7 = Colour::getB(this_01);
      glClearColor(fVar5,fVar6,fVar7,0);
      glEnable(0xbe2);
      glDisable(0xb71);
      glBlendFunc(0x302,0x303);
      Colour::~Colour(this_01);
      operator_delete(this_01);
      glfwSetWindowSizeCallback(handle,reshape);
      glfwSetKeyCallback(handle,key);
      while( true ) {
        ctx = handle;
        iVar2 = glfwWindowShouldClose(handle);
        if (iVar2 != 0) break;
        glClear(0x4000);
        if (state == MENU) {
          UIDisplayer::drawStartScreen(uiDisplayer);
        }
        else {
          UIDisplayer::drawGameplayScreen(uiDisplayer,world);
          GameplayDisplayer::drawWorld(gameplayDisplayer,world);
        }
        pWVar4 = world;
        if (state == PLAYING) {
          dVar8 = glfwGetTime();
          bVar1 = World::tick(pWVar4,(float)dVar8);
          if (!bVar1) {
            state = MENU;
          }
        }
        glfwSwapBuffers(handle);
        glfwPollEvents();
      }
      cleanup((EVP_PKEY_CTX *)ctx);
      glfwTerminate();
      exit(0);
    }
    fwrite("Failed to open GLFW window\n",0x1b,1,_stderr);
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    srand((int) time(0));

    GLFWwindow* window;

    if(!glfwInit()) {
        fprintf(stderr, "Failed to initialize GLFW\n" );
        exit(EXIT_FAILURE );
    }
    
    window = glfwCreateWindow(width, height, "lanaTetris", nullptr, nullptr);
    
    glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
    if(!window) {
        fprintf(stderr, "Failed to open GLFW window\n" );
        glfwTerminate();
        exit(EXIT_FAILURE );
    }
    
    glfwMakeContextCurrent(window);
    reshape(window, width, height);
    
    init(argc, argv);
    
    glfwSetWindowSizeCallback(window, reshape);
    glfwSetKeyCallback(window, key);
    
    while (!glfwWindowShouldClose(window)) {
        draw();
        if (state == PLAYING) {
            if (!world->tick(glfwGetTime())) state = MENU;
        }
        
        glfwSwapBuffers(window);
        glfwPollEvents();
    }
    
    cleanup();
    
    glfwTerminate();
    
    exit(EXIT_SUCCESS);
}